

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O1

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          unsigned_long batchSize,InnerRegisterSupplier *registerSupplier)

{
  undefined1 *puVar1;
  char *__s1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  _Manager_type p_Var4;
  pointer pSVar5;
  pointer pSVar6;
  unsigned_long uVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  *pvVar14;
  pointer poVar15;
  size_type sVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  writeBuffer;
  vector<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  frontLine;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currentFrontPointers;
  KeyValue<supermap::Key<30UL>,_unsigned_long> minItem;
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  local_158;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
  *local_138;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  *local_130;
  ulong local_128;
  size_type local_120;
  unsigned_long local_118;
  long local_110;
  vector<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  local_108;
  undefined1 local_f0 [40];
  bool local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type local_90;
  shared_ptr<supermap::io::FileManager> local_88;
  long local_70;
  long local_68;
  long local_60;
  KeyValue<supermap::Key<30UL>,_unsigned_long> local_58;
  
  local_138 = this;
  local_118 = batchSize;
  std::filesystem::__cxx11::path::path((path *)local_f0,dataFileName,auto_format);
  local_88.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_88.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_98 = (_Manager_type)0x0;
  local_a8 = (_Any_data)0x0;
  local_90 = registerSupplier->_M_invoker;
  p_Var4 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    local_a8 = (registerSupplier->super__Function_base)._M_functor;
    *(undefined1 (*) [16])&(registerSupplier->super__Function_base)._M_manager =
         (undefined1  [16])0x0;
    local_98 = p_Var4;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ::SingleFileIndexedStorage
            (&local_138->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
             ,(path *)local_f0,&local_88,(InnerRegisterSupplier *)&local_a8);
  if (local_98 != (_Manager_type)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_88.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path((path *)local_f0);
  (local_138->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ).
  super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00126ea8;
  (local_138->
  super_Findable<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::Key<30UL>_>).
  _vptr_Findable = (_func_int **)&DAT_00126ef0;
  pSVar5 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar16 = ((long)pSVar6 - (long)pSVar5 >> 3) * 0x6db6db6db6db6db7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c0,sVar16,(allocator_type *)local_f0);
  local_c8 = false;
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
  ::vector(&local_108,sVar16,(value_type *)local_f0,(allocator_type *)&local_58);
  local_130 = newer;
  if (pSVar6 == pSVar5) {
    lVar17 = 0;
    local_120 = sVar16;
  }
  else {
    lVar13 = sVar16 + (sVar16 == 0);
    lVar19 = 0x28;
    lVar20 = 0;
    lVar17 = 0;
    local_120 = sVar16;
    do {
      pSVar5 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (**(code **)(*(long *)((long)&(pSVar5->
                                             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             ).
                                             super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             .
                                             super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             ._vptr_OrderedStorage + lVar20) + 8))
                         ((long)&(pSVar5->
                                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 ).
                                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 .
                                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                 ._vptr_OrderedStorage + lVar20);
      poVar15 = local_108.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (lVar10 != 0) {
        pSVar5 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(*(long *)((long)&(pSVar5->
                                      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                      ).
                                      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                      ._vptr_OrderedStorage + lVar20) + 0x20))
                  (local_f0,(long)&(pSVar5->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   ._vptr_OrderedStorage + lVar20,0);
        if (*(char *)((long)&(poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload + lVar19) == '\x01') {
          *(undefined1 *)
           ((long)&(poVar15->
                   super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                   )._M_payload.
                   super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                   ._M_payload + lVar19) = 0;
        }
        puVar1 = (undefined1 *)
                 ((long)&(poVar15->
                         super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                         )._M_payload.
                         super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                         ._M_payload + lVar19);
        *(undefined8 *)(puVar1 + -8) = local_f0._32_8_;
        *(undefined8 *)(puVar1 + -0x18) = local_f0._16_8_;
        *(undefined8 *)(puVar1 + -0x10) = local_f0._24_8_;
        *(undefined8 *)(puVar1 + -0x28) = local_f0._0_8_;
        *(undefined8 *)(puVar1 + -0x20) = local_f0._8_8_;
        *puVar1 = 1;
        pSVar5 = (local_130->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (**(code **)(*(long *)((long)&(pSVar5->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                               ._vptr_OrderedStorage + lVar20) + 8))
                           ((long)&(pSVar5->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   ._vptr_OrderedStorage + lVar20);
        lVar17 = lVar17 + lVar10;
      }
      lVar20 = lVar20 + 0x38;
      lVar19 = lVar19 + 0x30;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  (*(local_138->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    ).
    super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
    ._vptr_Cloneable[5])
            (&(local_138->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              .register_,lVar17);
  local_158.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (KeyValue<supermap::Key<30UL>,_unsigned_long> *)0x0;
  local_158.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (KeyValue<supermap::Key<30UL>,_unsigned_long> *)0x0;
  local_158.
  super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (KeyValue<supermap::Key<30UL>,_unsigned_long> *)0x0;
  std::
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ::reserve(&local_158,local_118);
  sVar16 = (size_type)((int)local_120 - 1);
  local_60 = sVar16 + 1;
  local_68 = sVar16 * 0x38;
  local_70 = sVar16 * 0x30;
  pvVar14 = local_130;
  local_120 = sVar16;
  do {
    if ((int)sVar16 < 0) {
      lVar17 = 0;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      lVar13 = 0;
      lVar19 = local_68;
      lVar20 = local_60;
      lVar10 = local_70;
      do {
        lVar17 = lVar13;
        if ((&((local_108.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
              )._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
              _M_engaged)[lVar10] == true) {
          lVar17 = lVar20 + -1;
          if ((uVar11 & 1) == 0) {
            uVar11 = CONCAT71((int7)(uVar11 >> 8),1);
          }
          else {
            local_128 = uVar11;
            local_110 = lVar13;
            if (local_108.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar13].
                super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                ._M_engaged == false) {
              std::__throw_bad_optional_access();
            }
            __s1 = (char *)((long)&((local_108.
                                     super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                                   )._M_payload.
                                   super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                                   ._M_payload + lVar10);
            poVar15 = local_108.
                      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar13;
            iVar9 = memcmp(__s1,poVar15,0x1e);
            pvVar14 = local_130;
            uVar11 = local_128;
            if (-1 < iVar9) {
              auVar3 = *(undefined1 (*) [16])(__s1 + 0xe);
              auVar22[0] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0]
                            == *__s1);
              auVar22[1] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[1]
                            == __s1[1]);
              auVar22[2] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[2]
                            == __s1[2]);
              auVar22[3] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[3]
                            == __s1[3]);
              auVar22[4] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[4]
                            == __s1[4]);
              auVar22[5] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[5]
                            == __s1[5]);
              auVar22[6] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[6]
                            == __s1[6]);
              auVar22[7] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[7]
                            == __s1[7]);
              auVar22[8] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[8]
                            == __s1[8]);
              auVar22[9] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[9]
                            == __s1[9]);
              auVar22[10] = -((poVar15->
                              super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                              )._M_payload.
                              super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                              ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[10]
                             == __s1[10]);
              auVar22[0xb] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xb] == __s1[0xb]);
              auVar22[0xc] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xc] == __s1[0xc]);
              auVar22[0xd] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xd] == __s1[0xd]);
              auVar22[0xe] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xe] == __s1[0xe]);
              auVar22[0xf] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0xf] == __s1[0xf]);
              auVar21[0] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xe]
                            == auVar3[0]);
              auVar21[1] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems[0xf]
                            == auVar3[1]);
              auVar21[2] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x10] == auVar3[2]);
              auVar21[3] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x11] == auVar3[3]);
              auVar21[4] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x12] == auVar3[4]);
              auVar21[5] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x13] == auVar3[5]);
              auVar21[6] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x14] == auVar3[6]);
              auVar21[7] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x15] == auVar3[7]);
              auVar21[8] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x16] == auVar3[8]);
              auVar21[9] = -((poVar15->
                             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                             ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                             [0x17] == auVar3[9]);
              auVar21[10] = -((poVar15->
                              super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                              )._M_payload.
                              super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                              ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                              [0x18] == auVar3[10]);
              auVar21[0xb] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0x19] == auVar3[0xb]);
              auVar21[0xc] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0x1a] == auVar3[0xc]);
              auVar21[0xd] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0x1b] == auVar3[0xd]);
              auVar21[0xe] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0x1c] == auVar3[0xe]);
              auVar21[0xf] = -((poVar15->
                               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                               )._M_payload.
                               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                               ._M_payload._M_value.key.super_array<unsigned_char,_30UL>._M_elems
                               [0x1d] == auVar3[0xf]);
              auVar21 = auVar21 & auVar22;
              lVar17 = local_110;
              if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
                uVar7 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar20 + -1];
                local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar20 + -1] = uVar7 + 1;
                pSVar5 = (local_130->
                         super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                uVar11 = (**(code **)(*(long *)((long)&(pSVar5->
                                                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                                  ).
                                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                                  .
                                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                                  ._vptr_OrderedStorage + lVar19) + 8))
                                   ((long)&(pSVar5->
                                           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                           ).
                                           super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                           .
                                           super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                           ._vptr_OrderedStorage + lVar19);
                poVar15 = local_108.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (uVar7 + 1 < uVar11) {
                  pSVar5 = (pvVar14->
                           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  (**(code **)(*(long *)((long)&(pSVar5->
                                                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                                ).
                                                super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                                .
                                                super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                                ._vptr_OrderedStorage + lVar19) + 0x20))
                            (local_f0,(long)&(pSVar5->
                                             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             ).
                                             super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             .
                                             super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                             ._vptr_OrderedStorage + lVar19,
                             local_c0.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar20 + -1]);
                  if ((&(poVar15->
                        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                        )._M_payload.
                        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                        ._M_engaged)[lVar10] == true) {
                    (&(poVar15->
                      super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                      )._M_payload.
                      super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                      ._M_engaged)[lVar10] = false;
                  }
                  puVar2 = (undefined8 *)
                           ((long)&(poVar15->
                                   super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                                   )._M_payload.
                                   super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                                   ._M_payload + lVar10);
                  puVar2[4] = local_f0._32_8_;
                  puVar2[2] = local_f0._16_8_;
                  puVar2[3] = local_f0._24_8_;
                  *puVar2 = local_f0._0_8_;
                  puVar2[1] = local_f0._8_8_;
                  (&(poVar15->
                    super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                    ._M_engaged)[lVar10] = true;
                  lVar17 = local_110;
                  uVar11 = local_128;
                }
                else {
                  lVar17 = local_110;
                  uVar11 = local_128;
                  if ((&((local_108.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                        )._M_payload.
                        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                        ._M_engaged)[lVar10] == true) {
                    (&((local_108.
                        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                      )._M_payload.
                      super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                      ._M_engaged)[lVar10] = false;
                  }
                }
              }
            }
          }
        }
        lVar10 = lVar10 + -0x30;
        lVar19 = lVar19 + -0x38;
        lVar18 = lVar20 + -1;
        bVar8 = 0 < lVar20;
        lVar13 = lVar17;
        pvVar14 = local_130;
        lVar20 = lVar18;
      } while (lVar18 != 0 && bVar8);
    }
    if ((uVar11 & 1) == 0) break;
    if (local_108.
        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar17].
        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
        _M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    poVar15 = local_108.
              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar17;
    local_58.value =
         (poVar15->
         super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
         _M_payload.
         super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
         _M_payload._M_value.value;
    local_58.key.super_array<unsigned_char,_30UL>._M_elems._0_8_ =
         *(undefined8 *)
          &(poVar15->
           super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>)
           ._M_payload.
           super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
           _M_payload;
    local_58.key.super_array<unsigned_char,_30UL>._M_elems._8_8_ =
         *(undefined8 *)
          ((long)&(poVar15->
                  super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                  )._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                  ._M_payload + 8);
    local_58.key.super_array<unsigned_char,_30UL>._M_elems._16_8_ =
         *(undefined8 *)
          ((long)&(poVar15->
                  super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                  )._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                  ._M_payload + 0x10);
    local_58._24_8_ =
         *(undefined8 *)
          ((long)&(poVar15->
                  super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                  )._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                  ._M_payload + 0x18);
    iVar9 = (int)lVar17;
    uVar7 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9];
    local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[iVar9] = uVar7 + 1;
    pSVar5 = (pvVar14->
             super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (**(code **)(*(long *)&pSVar5[iVar9].
                                    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                    .
                                    super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                    .
                                    super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                         + 8))(pSVar5 + iVar9);
    poVar15 = local_108.
              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 + 1 < uVar12) {
      pSVar5 = (pvVar14->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      (**(code **)(*(long *)&pSVar5[iVar9].
                             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                             .
                             super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                             .
                             super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                  + 0x20))
                (local_f0,pSVar5 + iVar9,
                 local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9]);
      poVar15 = poVar15 + iVar9;
      if ((poVar15->
          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
          _M_engaged == true) {
        (poVar15->
        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
        _M_engaged = false;
      }
      (poVar15->
      super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
      _M_payload._M_value.value = local_f0._32_8_;
      *(undefined8 *)
       ((long)&(poVar15->
               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
               ._M_payload + 0x10) = local_f0._16_8_;
      *(undefined8 *)
       ((long)&(poVar15->
               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
               ._M_payload + 0x18) = local_f0._24_8_;
      *(undefined8 *)
       &(poVar15->
        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
        _M_payload = local_f0._0_8_;
      *(undefined8 *)
       ((long)&(poVar15->
               super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
               ._M_payload + 8) = local_f0._8_8_;
      (poVar15->
      super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
      _M_engaged = true;
    }
    else if (local_108.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar9].
             super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
             _M_engaged == true) {
      local_108.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar9].
      super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
      _M_engaged = false;
    }
    sVar16 = local_120;
    if (local_158.
        super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_158.
        super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>
      ::_M_realloc_insert<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>
                ((vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>
                  *)&local_158,
                 (iterator)
                 local_158.
                 super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_58);
    }
    else {
      (local_158.
       super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->value = local_58.value;
      *(undefined8 *)
       (((local_158.
          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->key).super_array<unsigned_char,_30UL>.
        _M_elems + 0x10) = local_58.key.super_array<unsigned_char,_30UL>._M_elems._16_8_;
      *(undefined8 *)
       (((local_158.
          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->key).super_array<unsigned_char,_30UL>.
        _M_elems + 0x18) = local_58._24_8_;
      *(undefined8 *)
       ((local_158.
         super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->key).super_array<unsigned_char,_30UL>._M_elems
           = local_58.key.super_array<unsigned_char,_30UL>._M_elems._0_8_;
      *(undefined8 *)
       (((local_158.
          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->key).super_array<unsigned_char,_30UL>.
        _M_elems + 8) = local_58.key.super_array<unsigned_char,_30UL>._M_elems._8_8_;
      local_158.
      super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_158.
           super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if (local_118 <=
        (ulong)(((long)local_158.
                       super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_158.
                       super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
      SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
      ::
      appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,void>
                ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
                  *)local_138);
      if (local_158.
          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_158.
          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_158.
        super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_158.
             super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      std::
      vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
      ::reserve(&local_158,local_118);
    }
  } while ((uVar11 & 1) != 0);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
  ::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
              *)local_138,
             local_158.
             super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_158.
             super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_158.
      super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_158.
      super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_158.
    super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_158.
         super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
  ::reserve(&local_158,local_118);
  if (local_158.
      super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (KeyValue<supermap::Key<30UL>,_unsigned_long> *)0x0) {
    operator_delete(local_158.
                    super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }